

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencc.c
# Opt level: O3

opencc_t opencc_open(char *config_file)

{
  undefined8 *puVar1;
  converter_t t_converter;
  config_t t_config;
  dictionary_set_t dictionary_set;
  
  if (lib_initialized == '\0') {
    lib_initialized = '\x01';
  }
  puVar1 = (undefined8 *)malloc(0x10);
  *puVar1 = 0;
  t_converter = converter_open();
  puVar1[1] = t_converter;
  converter_set_conversion_mode(t_converter,OPENCC_CONVERSION_FAST);
  if (config_file != (char *)0x0) {
    t_config = config_open(config_file);
    if (t_config == (config_t)0xffffffffffffffff) {
      errnum = OPENCC_ERROR_CONFIG;
      puVar1 = (undefined8 *)0xffffffffffffffff;
    }
    else {
      dictionary_set = config_get_dictionary_set(t_config);
      *puVar1 = dictionary_set;
      converter_assign_dictionary(t_converter,dictionary_set);
      config_close(t_config);
    }
  }
  return puVar1;
}

Assistant:

opencc_t opencc_open(const char * config_file)
{
	if (!lib_initialized)
		lib_initialize();

	opencc_desc * opencc;
	opencc = (opencc_desc *) malloc(sizeof(opencc_desc));

	opencc->dictionary_set = NULL;
	opencc->converter = converter_open();
	converter_set_conversion_mode(opencc->converter, OPENCC_CONVERSION_FAST);

	/* 加載默認辭典 */
	int retval;
	if (config_file == NULL)
		retval = 0;
	else
	{
		config_t config = config_open(config_file);

		if (config == (config_t) -1)
		{
			errnum = OPENCC_ERROR_CONFIG;
			return (opencc_t) -1;
		}

		opencc->dictionary_set = config_get_dictionary_set(config);
		converter_assign_dictionary(opencc->converter, opencc->dictionary_set);

		config_close(config);
	}

	return (opencc_t) opencc;
}